

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<ClassDef>::end(QList<ClassDef> *this)

{
  ClassDef *n;
  QArrayDataPointer<ClassDef> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<ClassDef> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<ClassDef> *)0x154a39);
  QArrayDataPointer<ClassDef>::operator->(in_RDI);
  n = QArrayDataPointer<ClassDef>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }